

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.h
# Opt level: O2

void __thiscall
chrono::ChLoadBodyBodyTorque::ChLoadBodyBodyTorque
          (ChLoadBodyBodyTorque *this,ChLoadBodyBodyTorque *param_1)

{
  ChLoadBodyBody::ChLoadBodyBody(&this->super_ChLoadBodyBody,&param_1->super_ChLoadBodyBody);
  (this->super_ChLoadBodyBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyBodyTorque_0116ce78;
  (this->m_torque).m_data[0] = (param_1->m_torque).m_data[0];
  (this->m_torque).m_data[1] = (param_1->m_torque).m_data[1];
  (this->m_torque).m_data[2] = (param_1->m_torque).m_data[2];
  this->m_local_torque = param_1->m_local_torque;
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_modulation).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &(param_1->m_modulation).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  this->m_scale = param_1->m_scale;
  return;
}

Assistant:

class ChApi ChLoadBodyBodyTorque : public ChLoadBodyBody {
  public:
    ChLoadBodyBodyTorque(std::shared_ptr<ChBody> bodyA,  ///< first body
                         std::shared_ptr<ChBody> bodyB,  ///< second body
                         const ChVector<> torque,        ///< applied torque
                         bool local_torque               ///< torque is in bodyB local coords
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadBodyBodyTorque* Clone() const override { return new ChLoadBodyBodyTorque(*this); }

    /// Set modulation function.
    /// This is a function of time which (optionally) modulates the specified applied torque.
    /// By default the modulation is a constant function, always returning a value of 1.
    void SetModulationFunction(std::shared_ptr<ChFunction> modulation) { m_modulation = modulation; }

  private:
    ChVector<> m_torque;  ///< base torque value
    bool m_local_torque;  ///< is torque expressed in local frame (bodyB)?

    std::shared_ptr<ChFunction> m_modulation;  ///< modulation function of time
    double m_scale;                            ///< scaling factor (current modulation value)

    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;

    /// Implement the computation of the body-body force, in local
    /// coordinates of the loc_application_B.
    /// Force is assumed applied to loc_application_B of body B, and its opposite reaction to A.
    virtual void ComputeBodyBodyForceTorque(const ChFrameMoving<>& rel_AB,
                                            ChVector<>& loc_force,
                                            ChVector<>& loc_torque) override;
}